

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O2

TestStatus *
vkt::clipping::anon_unknown_0::ClipVolume::testLargePoints
          (TestStatus *__return_storage_ptr__,Context *context)

{
  DrawState *this;
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  int iVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  string local_2b8;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  Vector<float,_4> local_27c;
  DrawState drawState;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  ConstPixelBufferAccess local_240;
  VulkanDrawContext drawContext;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,0x80);
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"vert",(allocator<char> *)&drawState);
  local_2b8._M_string_length =
       (size_type)::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  local_2b8._M_dataplus._M_p._0_4_ = 1;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&local_2b8);
  std::__cxx11::string::~string((string *)&drawContext);
  pPVar1 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawContext,"frag",(allocator<char> *)&drawState);
  local_2b8._M_string_length =
       (size_type)::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)&drawContext);
  local_2b8._M_dataplus._M_p._0_4_ = 0x10;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&local_2b8);
  std::__cxx11::string::~string((string *)&drawContext);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf8ccccdbf8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3dcccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f8ccccdbf8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3e4ccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f8ccccd3f8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3ecccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf8ccccd3f8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3f19999a;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf8ccccd00000000;
  drawContext.super_DrawContext.m_drawState.topology = 0x3f4ccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3f666666;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f8ccccd00000000;
  drawContext.super_DrawContext.m_drawState.topology = 0x3dcccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf8ccccd;
  drawContext.super_DrawContext.m_drawState.topology = 0x3e4ccccd;
  drawContext.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&drawContext);
  drawContext.super_DrawContext._vptr_DrawContext = (_func_int **)context->m_testCtx->m_log;
  this = &drawContext.super_DrawContext.m_drawState;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,
                  "Drawing several large points just outside the clip volume. Expecting an empty image."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&drawContext,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  drawutil::DrawState::DrawState(&drawState,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0x10,0x10);
  vulkanProgram.shaders = &shaders;
  drawCallData.vertices = &vertices;
  drawutil::VulkanDrawContext::VulkanDrawContext
            (&drawContext,context,&drawState,&drawCallData,&vulkanProgram);
  drawutil::VulkanDrawContext::draw(&drawContext);
  drawutil::VulkanDrawContext::getColorPixels(&local_240,&drawContext);
  local_2b8._M_dataplus._M_p = (pointer)0x0;
  local_2b8._M_string_length = 0x3f80000000000000;
  tcu::Vector<float,_4>::Vector(&local_27c);
  iVar2 = countPixels(&local_240,(Vec4 *)&local_2b8,&local_27c);
  if (iVar2 == 0x100) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"OK",(allocator<char> *)&local_27c);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2b8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"Rendered image(s) are incorrect",(allocator<char> *)&local_27c)
    ;
    tcu::TestStatus::fail(__return_storage_ptr__,&local_2b8);
  }
  std::__cxx11::string::~string((string *)&local_2b8);
  drawutil::VulkanDrawContext::~VulkanDrawContext(&drawContext);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~_Vector_base
            (&shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testLargePoints (Context& context)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_LARGE_POINTS);

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));

	std::vector<Vec4> vertices;
	{
		const float delta	= 0.1f;  // much smaller than the point size
		const float p		= 1.0f + delta;

		vertices.push_back(Vec4(  -p,   -p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p,    p, 0.2f, 1.0f));
		vertices.push_back(Vec4(   p,    p, 0.4f, 1.0f));
		vertices.push_back(Vec4(   p,   -p, 0.6f, 1.0f));
		vertices.push_back(Vec4(0.0f,   -p, 0.8f, 1.0f));
		vertices.push_back(Vec4(   p, 0.0f, 0.9f, 1.0f));
		vertices.push_back(Vec4(0.0f,    p, 0.1f, 1.0f));
		vertices.push_back(Vec4(  -p, 0.0f, 0.2f, 1.0f));
	}

	tcu::TestLog&	log	= context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing several large points just outside the clip volume. Expecting an empty image." << tcu::TestLog::EndMessage;

	DrawState			drawState		(VK_PRIMITIVE_TOPOLOGY_POINT_LIST, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// All pixels must be black -- nothing is drawn.
	const int numBlackPixels = countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == NUM_RENDER_PIXELS ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}